

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

void __thiscall
TCV::checkIfClassFunctionCalledWithRightAccess
          (TCV *this,string *nodeName,ASTNode *_node,bool isCalledOnFunction)

{
  bool bVar1;
  ASTNode *pAVar2;
  ulong uVar3;
  Variable *pVVar4;
  Class *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
  *this_01;
  mapped_type *__x;
  Function *pFVar5;
  string *psVar6;
  undefined1 local_c0 [8];
  string errorString_1;
  string errorString;
  Function *function;
  mapped_type functions;
  undefined1 local_50 [8];
  string objectType;
  ASTNode *object;
  bool isCalledOnFunction_local;
  ASTNode *_node_local;
  string *nodeName_local;
  TCV *this_local;
  
  pAVar2 = AST::ASTNode::getParent(_node);
  pAVar2 = AST::ASTNode::getChild(pAVar2,lastProcessedNode);
  objectType.field_2._8_8_ = AST::ASTNode::getChild(pAVar2,0);
  if (isCalledOnFunction) {
    std::__cxx11::string::string((string *)local_50,(string *)&this->returnType);
  }
  else {
    std::__cxx11::string::string((string *)local_50);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    bVar1 = std::operator==(&this->currentFuncName,"main");
    if (bVar1) {
      pFVar5 = this->symbolTable->main;
      psVar6 = AST::ASTNode::getName_abi_cxx11_((ASTNode *)objectType.field_2._8_8_);
      pVVar4 = Function::getVariable(pFVar5,psVar6);
      psVar6 = Variable::getType_abi_cxx11_(pVVar4);
      std::__cxx11::string::operator=((string *)local_50,(string *)psVar6);
    }
    else {
      pFVar5 = this->currentFunction;
      psVar6 = AST::ASTNode::getName_abi_cxx11_((ASTNode *)objectType.field_2._8_8_);
      pVVar4 = Function::getVariable(pFVar5,psVar6);
      psVar6 = Variable::getType_abi_cxx11_(pVVar4);
      std::__cxx11::string::operator=((string *)local_50,(string *)psVar6);
    }
  }
  this_00 = Semantic::SymbolTable::getClass(this->symbolTable,(string *)local_50);
  this_01 = Class::getFunctions_abi_cxx11_(this_00);
  __x = std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>_>
        ::at(this_01,nodeName);
  std::vector<Function_*,_std::allocator<Function_*>_>::vector
            ((vector<Function_*,_std::allocator<Function_*>_> *)&function,__x);
  pFVar5 = getRightFunction(this,(vector<Function_*,_std::allocator<Function_*>_> *)&function,_node)
  ;
  if ((pFVar5 == (Function *)0x0) || (bVar1 = Function::isPrivate(pFVar5), !bVar1)) {
    if (pFVar5 == (Function *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     "no matching function name ",nodeName);
      Semantic::Detector::addError(this->detector,(string *)local_c0);
      std::__cxx11::string::~string((string *)local_c0);
    }
    else {
      psVar6 = Function::getReturnType_abi_cxx11_(pFVar5);
      std::__cxx11::string::operator=((string *)&this->returnType,(string *)psVar6);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&errorString_1.field_2 + 8),"Accessing private function name ",nodeName);
    Semantic::Detector::addError(this->detector,(string *)((long)&errorString_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(errorString_1.field_2._M_local_buf + 8));
  }
  std::vector<Function_*,_std::allocator<Function_*>_>::~vector
            ((vector<Function_*,_std::allocator<Function_*>_> *)&function);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void
TCV::checkIfClassFunctionCalledWithRightAccess(std::string &nodeName, AST::ASTNode *_node, bool isCalledOnFunction) {
    auto object = _node->getParent()->getChild(lastProcessedNode)->getChild(0);

    //if there is a chain of function calls, the return type
    //of the last processed function is the object type that
    //next function should be called on.
    std::string objectType = isCalledOnFunction ? returnType : std::string();

    //if in main function scope, we need to fetch main function local variable
    if (objectType.empty()) {
        if (currentFuncName == "main") objectType = symbolTable->main->getVariable(object->getName())->getType();
        else objectType = currentFunction->getVariable(object->getName())->getType();
    }
    auto functions = symbolTable->getClass(objectType)->getFunctions().at(nodeName);

    auto function = getRightFunction(functions, _node);
    if (function != nullptr && function->isPrivate()) {
        std::string errorString = "Accessing private function name " + nodeName;
        detector->addError(errorString);
    } else if (function == nullptr) {
        std::string errorString = "no matching function name " + nodeName;
        detector->addError(errorString);
    } else returnType = function->getReturnType();

}